

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O3

void lace_steal_external(WorkerP *self,Task *dq_head)

{
  __pointer_type p_Var1;
  Task *pTVar2;
  ExtTask *pEVar3;
  
  pEVar3 = external_task;
  LOCK();
  external_task = (ExtTask *)0x0;
  UNLOCK();
  if (pEVar3 != (ExtTask *)0x0) {
    p_Var1 = self->_public;
    pTVar2 = pEVar3->task;
    LOCK();
    (pTVar2->thief)._M_b._M_p = p_Var1;
    UNLOCK();
    (pTVar2->thief)._M_b._M_p = p_Var1;
    (*pEVar3->task->f)(self,dq_head,pEVar3->task);
    (pEVar3->task->thief)._M_b._M_p = (__pointer_type)0x2;
    sem_post((sem_t *)&pEVar3->sem);
    return;
  }
  return;
}

Assistant:

static inline void
lace_steal_external(WorkerP *self, Task *dq_head) 
{
    ExtTask *stolen_task = atomic_exchange(&external_task, NULL);
    if (stolen_task != 0) {
        // execute task
        stolen_task->task->thief = self->_public;
        atomic_store_explicit(&stolen_task->task->thief, self->_public, memory_order_relaxed);
        lace_time_event(self, 1);
        // atomic_thread_fence(memory_order_relaxed);
        stolen_task->task->f(self, dq_head, stolen_task->task);
        // atomic_thread_fence(memory_order_relaxed);
        lace_time_event(self, 2);
        // atomic_thread_fence(memory_order_relaxed);
        atomic_store_explicit(&stolen_task->task->thief, THIEF_COMPLETED, memory_order_relaxed);
        // atomic_thread_fence(memory_order_relaxed);
        sem_post(&stolen_task->sem);
        lace_time_event(self, 8);
    }
}